

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# record-replay.cpp
# Opt level: O0

bool __thiscall
replay_entry_t::load
          (replay_entry_t *this,char *type,char *pedigee_str,int32_t value1,int32_t value2)

{
  short sVar1;
  int iVar2;
  long lVar3;
  void *pvVar4;
  undefined2 in_CX;
  char *in_RDX;
  char *in_RSI;
  long *in_RDI;
  int n;
  uint64_t temp_pedigree [256];
  char *end;
  char *p;
  int local_83c;
  long alStack_838 [256];
  char *local_38;
  char *local_30;
  undefined2 local_24;
  char *local_20;
  char *local_18;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_24 = in_CX;
  iVar2 = strcmp(in_RSI,"Steal");
  if (iVar2 == 0) {
    *(undefined4 *)(in_RDI + 1) = 1;
    *(undefined2 *)((long)in_RDI + 0xe) = local_24;
  }
  else {
    *(undefined2 *)((long)in_RDI + 0xe) = 0xffff;
    iVar2 = strcmp(local_18,"Sync");
    if (iVar2 == 0) {
      *(undefined4 *)(in_RDI + 1) = 2;
    }
    else {
      iVar2 = strcmp(local_18,"Orphaned");
      if (iVar2 != 0) {
        *(undefined4 *)(in_RDI + 1) = 0;
        return false;
      }
      *(undefined4 *)(in_RDI + 1) = 3;
    }
  }
  *(undefined2 *)((long)in_RDI + 0xc) = 0;
  local_30 = local_20;
  while( true ) {
    lVar3 = strtol(local_30,&local_38,10);
    sVar1 = *(short *)((long)in_RDI + 0xc);
    *(short *)((long)in_RDI + 0xc) = sVar1 + 1;
    alStack_838[sVar1] = lVar3;
    if (*local_38 == '\0') break;
    local_30 = local_38 + 1;
  }
  pvVar4 = __cilkrts_malloc(0x110384);
  *in_RDI = (long)pvVar4;
  for (local_83c = 0; local_83c < *(short *)((long)in_RDI + 0xc); local_83c = local_83c + 1) {
    *(long *)(*in_RDI + (long)local_83c * 8) =
         alStack_838[(*(short *)((long)in_RDI + 0xc) + -1) - local_83c];
  }
  return true;
}

Assistant:

bool load(const char *type, const char *pedigee_str, int32_t value1, int32_t value2)
    {
        // Convert the type into an enum
        if (0 == strcmp(type, PED_TYPE_STR_STEAL))
        {
            m_type = ped_type_steal;
            m_value = (int16_t)value1;   // Victim
        }
        else
        {
            m_value = -1;      // Victim not valid
            if (0 == strcmp(type, PED_TYPE_STR_SYNC))
                m_type = ped_type_sync;
            else if (0 == strcmp(type, PED_TYPE_STR_ORPHANED))
                m_type = ped_type_orphaned;
            else
            {
                m_type = ped_type_unknown;
                return false;
            }
        }

        // Parse the pedigree
        m_pedigree_len = 0;

        const char *p = pedigee_str;
        char *end;

        uint64_t temp_pedigree[PEDIGREE_BUFF_SIZE/2];

        while(1)
        {
            temp_pedigree[m_pedigree_len++] = (uint64_t)strtol(p, &end, 10);
            if ('\0' == *end)
                break;
            p = end + 1;
        }

        // Allocate memory to hold the pedigree.
        // Copy the pedigree in reverse order since that's the order we'll
        // traverse it
        m_reverse_pedigree =
            (uint64_t *)__cilkrts_malloc(sizeof(int64_t) * m_pedigree_len);
        for (int n = 0; n < m_pedigree_len; n++)
            m_reverse_pedigree[n] = temp_pedigree[(m_pedigree_len - 1) - n];

        return true;
    }